

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
Belief::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Belief *this,VectorSet *v
          )

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  size_type sVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,v->size1_,&local_19);
  pdVar2 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar4 = v->size1_;
  pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, sVar4 != uVar7; uVar6 = uVar6 + 1) {
    auVar10 = ZEXT816(0) << 0x40;
    for (uVar8 = 0; uVar9 = (ulong)uVar8, (long)pdVar3 - (long)pdVar2 >> 3 != uVar9;
        uVar8 = uVar8 + 1) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pdVar2[uVar9];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (v->data_).data_[v->size2_ * uVar7 + uVar9];
      auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar1);
    }
    pdVar5[uVar7] = auVar10._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v) const
{
    vector<double> values(v.size1());

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        x=0;
        for(unsigned int s=0; s!=_m_b.size(); ++s)
            x+=_m_b[s]*v(k,s);
        values[k]=x;
    }

    return(values);
}